

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O1

int X509V3_EXT_print(BIO *out,X509_EXTENSION *ext,ulong flag,int indent)

{
  uint uVar1;
  int iVar2;
  X509V3_EXT_METHOD *method;
  ASN1_OCTET_STRING *str;
  ASN1_VALUE *val;
  char *pcVar3;
  OPENSSL_STACK *sk;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  OPENSSL_STACK *pOVar7;
  uchar *p;
  uint local_48;
  uchar *local_38;
  
  method = X509V3_EXT_get(ext);
  if (method == (X509V3_EXT_METHOD *)0x0) {
    iVar2 = unknown_ext_print((BIO *)out,(X509_EXTENSION *)ext,flag,indent,0);
    return iVar2;
  }
  str = X509_EXTENSION_get_data(ext);
  local_38 = ASN1_STRING_get0_data((ASN1_STRING *)str);
  iVar2 = ASN1_STRING_length(str);
  val = ASN1_item_d2i((ASN1_VALUE **)0x0,&local_38,(long)iVar2,method->it);
  if (val == (ASN1_VALUE *)0x0) {
    iVar2 = unknown_ext_print((BIO *)out,(X509_EXTENSION *)ext,flag,indent,1);
    return iVar2;
  }
  if (method->i2s == (X509V3_EXT_I2S)0x0) {
    if (method->i2v != (X509V3_EXT_I2V)0x0) {
      pcVar3 = (char *)0x0;
      sk = (OPENSSL_STACK *)(*method->i2v)(method,val,(stack_st_CONF_VALUE *)0x0);
      local_48 = 0;
      pOVar7 = (OPENSSL_STACK *)0x0;
      if (sk != (OPENSSL_STACK *)0x0) {
        uVar1 = method->ext_flags;
        if (((uVar1 & 4) == 0) || (sVar4 = OPENSSL_sk_num(sk), sVar4 == 0)) {
          BIO_printf(out,"%*s",(ulong)(uint)indent,"");
          sVar4 = OPENSSL_sk_num(sk);
          if (sVar4 == 0) {
            BIO_puts(out,"<EMPTY>\n");
          }
        }
        sVar4 = OPENSSL_sk_num(sk);
        local_48 = 1;
        pOVar7 = sk;
        if (sVar4 == 0) {
          pcVar3 = (char *)0x0;
        }
        else {
          sVar4 = 0;
          do {
            if ((uVar1 & 4) == 0) {
              if (sVar4 != 0) {
                BIO_printf(out,", ");
              }
            }
            else {
              BIO_printf(out,"%*s",(ulong)(uint)indent,"");
            }
            pvVar5 = OPENSSL_sk_value(sk,sVar4);
            pcVar3 = *(char **)((long)pvVar5 + 0x10);
            if ((*(char **)((long)pvVar5 + 8) == (char *)0x0) ||
               (pcVar3 = *(char **)((long)pvVar5 + 8),
               *(char **)((long)pvVar5 + 0x10) == (char *)0x0)) {
              BIO_puts(out,pcVar3);
            }
            else {
              BIO_printf(out,"%s:%s");
            }
            if ((uVar1 & 4) != 0) {
              BIO_puts(out,"\n");
            }
            sVar4 = sVar4 + 1;
            sVar6 = OPENSSL_sk_num(sk);
          } while (sVar4 < sVar6);
          pcVar3 = (char *)0x0;
        }
      }
      goto LAB_0032f18c;
    }
    if (method->i2r != (X509V3_EXT_I2R)0x0) {
      iVar2 = (*method->i2r)(method,val,out,indent);
      local_48 = (uint)(iVar2 != 0);
      pcVar3 = (char *)0x0;
      pOVar7 = (OPENSSL_STACK *)0x0;
      goto LAB_0032f18c;
    }
    ERR_put_error(0x14,0,0x93,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_prn.cc"
                  ,0x60);
  }
  else {
    pcVar3 = (*method->i2s)(method,val);
    if (pcVar3 != (char *)0x0) {
      BIO_printf(out,"%*s%s",(ulong)(uint)indent,"",pcVar3);
      local_48 = 1;
      pOVar7 = (OPENSSL_STACK *)0x0;
      goto LAB_0032f18c;
    }
  }
  pcVar3 = (char *)0x0;
  local_48 = 0;
  pOVar7 = (OPENSSL_STACK *)0x0;
LAB_0032f18c:
  OPENSSL_sk_pop_free_ex(pOVar7,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
  OPENSSL_free(pcVar3);
  ASN1_item_free(val,method->it);
  return local_48;
}

Assistant:

int X509V3_EXT_print(BIO *out, const X509_EXTENSION *ext, unsigned long flag,
                     int indent) {
  const X509V3_EXT_METHOD *method = X509V3_EXT_get(ext);
  if (method == NULL) {
    return unknown_ext_print(out, ext, flag, indent, 0);
  }
  const ASN1_STRING *ext_data = X509_EXTENSION_get_data(ext);
  const unsigned char *p = ASN1_STRING_get0_data(ext_data);
  void *ext_str = ASN1_item_d2i(NULL, &p, ASN1_STRING_length(ext_data),
                                ASN1_ITEM_ptr(method->it));
  if (!ext_str) {
    return unknown_ext_print(out, ext, flag, indent, 1);
  }

  char *value = NULL;
  STACK_OF(CONF_VALUE) *nval = NULL;
  int ok = 0;
  if (method->i2s) {
    if (!(value = method->i2s(method, ext_str))) {
      goto err;
    }
    BIO_printf(out, "%*s%s", indent, "", value);
  } else if (method->i2v) {
    if (!(nval = method->i2v(method, ext_str, NULL))) {
      goto err;
    }
    X509V3_EXT_val_prn(out, nval, indent,
                       method->ext_flags & X509V3_EXT_MULTILINE);
  } else if (method->i2r) {
    if (!method->i2r(method, ext_str, out, indent)) {
      goto err;
    }
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_OPERATION_NOT_DEFINED);
    goto err;
  }

  ok = 1;

err:
  sk_CONF_VALUE_pop_free(nval, X509V3_conf_free);
  OPENSSL_free(value);
  ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ext_str),
                 ASN1_ITEM_ptr(method->it));
  return ok;
}